

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void code_input_cb(Fl_Input *i,void *param_2)

{
  char *__s1;
  int iVar1;
  char *__s2;
  void *param_1_local;
  Fl_Input *i_local;
  
  __s1 = code_file_name;
  if (code_file_name != (char *)0x0) {
    __s2 = Fl_Input_::value(&i->super_Fl_Input_);
    iVar1 = strcmp(__s1,__s2);
    if (iVar1 != 0) {
      set_modflag(1);
    }
  }
  code_file_name = Fl_Input_::value(&i->super_Fl_Input_);
  return;
}

Assistant:

void code_input_cb(Fl_Input* i, void*) {
  if (code_file_name && strcmp(code_file_name, i->value()))
    set_modflag(1);
  code_file_name = i->value();
}